

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testProcrustes.cpp
# Opt level: O3

void testTranslationRotationMatrix<double>(M44d *mat)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  double *weights;
  long lVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double dVar13;
  double dVar14;
  vector<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_> to;
  vector<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_> from;
  M44d m1;
  M44d m2;
  vector<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_> local_248;
  vector<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_> local_228;
  double local_208;
  undefined8 uStack_200;
  double local_1f8;
  double local_1e8;
  double dStack_1e0;
  double local_1d8;
  double dStack_1d0;
  double local_1c8;
  double local_1c0;
  double local_1b8;
  double local_1b0;
  double local_1a8;
  double local_1a0;
  Vec3<double> local_198;
  double local_178;
  double dStack_170;
  double local_168;
  double dStack_160;
  double local_158;
  undefined8 uStack_150;
  double local_148;
  double dStack_140;
  M44d local_138;
  M44d local_b8;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Testing known translate/rotate matrix:\n ",0x28);
  Imath_2_5::operator<<((ostream *)&std::cout,mat);
  if (testTranslationRotationMatrix<double>(Imath_2_5::Matrix44<double>const&)::rand == '\0') {
    testTranslationRotationMatrix<double>();
  }
  local_228.super__Vector_base<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (Vec3<double> *)0x0;
  local_228.super__Vector_base<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_228.super__Vector_base<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_>::reserve
            (&local_228,7);
  local_248.super__Vector_base<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (Vec3<double> *)0x0;
  local_248.super__Vector_base<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_248.super__Vector_base<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar5 = 7;
  std::vector<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_>::reserve
            (&local_248,7);
  do {
    local_1f8 = Imath_2_5::erand48(testTranslationRotationMatrix<double>::rand._state);
    local_208 = Imath_2_5::erand48(testTranslationRotationMatrix<double>::rand._state);
    local_1d8 = Imath_2_5::erand48(testTranslationRotationMatrix<double>::rand._state);
    local_168 = mat->x[0][0];
    dStack_160 = mat->x[0][1];
    local_178 = mat->x[1][0];
    dStack_170 = mat->x[1][1];
    local_148 = mat->x[2][0];
    dStack_140 = mat->x[2][1];
    local_1e8 = mat->x[3][0];
    dStack_1e0 = mat->x[3][1];
    local_1b8 = mat->x[0][2];
    local_1c8 = mat->x[1][2];
    local_1c0 = mat->x[2][2];
    dVar6 = mat->x[3][2];
    local_1a0 = mat->x[0][3];
    local_1b0 = mat->x[1][3];
    local_1a8 = mat->x[2][3];
    local_158 = mat->x[3][3];
    uStack_150 = 0;
    local_138.x[0][1] = local_208;
    local_138.x[0][0] = local_1f8;
    local_138.x[0][2] = local_1d8;
    std::vector<Imath_2_5::Vec3<double>,std::allocator<Imath_2_5::Vec3<double>>>::
    emplace_back<Imath_2_5::Vec3<double>>
              ((vector<Imath_2_5::Vec3<double>,std::allocator<Imath_2_5::Vec3<double>>> *)&local_228
               ,(Vec3<double> *)&local_138);
    dVar3 = local_158 + local_1a8 * local_1d8 + local_1a0 * local_1f8 + local_1b0 * local_208;
    local_138.x[0][2] =
         (dVar6 + local_1c0 * local_1d8 + local_1b8 * local_1f8 + local_1c8 * local_208) / dVar3;
    auVar8._0_8_ = local_1e8 + local_1d8 * local_148 + local_1f8 * local_168 + local_208 * local_178
    ;
    auVar8._8_8_ = dStack_1e0 +
                   local_1d8 * dStack_140 + local_1f8 * dStack_160 + local_208 * dStack_170;
    auVar10._8_4_ = SUB84(dVar3,0);
    auVar10._0_8_ = dVar3;
    auVar10._12_4_ = (int)((ulong)dVar3 >> 0x20);
    local_138.x[0]._0_16_ = divpd(auVar8,auVar10);
    std::vector<Imath_2_5::Vec3<double>,std::allocator<Imath_2_5::Vec3<double>>>::
    emplace_back<Imath_2_5::Vec3<double>>
              ((vector<Imath_2_5::Vec3<double>,std::allocator<Imath_2_5::Vec3<double>>> *)&local_248
               ,(Vec3<double> *)&local_138);
    lVar5 = lVar5 + -1;
  } while (lVar5 != 0);
  weights = (double *)operator_new(0x38);
  auVar8 = _DAT_00165860;
  auVar10 = _DAT_0015e200;
  lVar5 = 0;
  do {
    auVar11._8_4_ = (int)lVar5;
    auVar11._0_8_ = lVar5;
    auVar11._12_4_ = (int)((ulong)lVar5 >> 0x20);
    auVar11 = (auVar11 | auVar8) ^ auVar10;
    if (auVar11._4_4_ == -0x80000000 && auVar11._0_4_ < -0x7ffffff9) {
      weights[lVar5] = 1.0;
      weights[lVar5 + 1] = 1.0;
    }
    lVar5 = lVar5 + 2;
  } while (lVar5 != 8);
  Imath_2_5::procrustesRotationAndTranslation<double>
            (&local_138,
             local_228.
             super__Vector_base<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_>.
             _M_impl.super__Vector_impl_data._M_start,
             local_248.
             super__Vector_base<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_>.
             _M_impl.super__Vector_impl_data._M_start,weights,7,false);
  Imath_2_5::procrustesRotationAndTranslation<double>
            (&local_b8,
             local_228.
             super__Vector_base<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_>.
             _M_impl.super__Vector_impl_data._M_start,
             local_248.
             super__Vector_base<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_>.
             _M_impl.super__Vector_impl_data._M_start,7,false);
  lVar5 = 0x10;
  while( true ) {
    dVar6 = *(double *)
             ((long)local_228.
                    super__Vector_base<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + lVar5 + -0x10);
    dVar3 = *(double *)
             ((long)local_228.
                    super__Vector_base<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + lVar5 + -8);
    dVar2 = *(double *)
             ((long)&(local_228.
                      super__Vector_base<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->x + lVar5);
    local_1f8 = *(double *)
                 ((long)&(local_248.
                          super__Vector_base<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->x + lVar5);
    dVar13 = local_138.x[2][3] * dVar2 + local_138.x[0][3] * dVar6 + local_138.x[1][3] * dVar3 +
             local_138.x[3][3];
    auVar12._8_8_ = dVar13;
    auVar12._0_8_ = dVar13;
    pdVar1 = (double *)
             ((long)local_248.
                    super__Vector_base<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + lVar5 + -0x10);
    local_1d8 = *pdVar1;
    dStack_1d0 = pdVar1[1];
    local_1e8 = local_b8.x[2][0] * dVar2 + local_b8.x[0][0] * dVar6 + local_b8.x[1][0] * dVar3 +
                local_b8.x[3][0];
    dStack_1e0 = local_b8.x[2][1] * dVar2 + local_b8.x[0][1] * dVar6 + local_b8.x[1][1] * dVar3 +
                 local_b8.x[3][1];
    dVar14 = local_b8.x[2][2] * dVar2 + local_b8.x[0][2] * dVar6 + local_b8.x[1][2] * dVar3 +
             local_b8.x[3][2];
    local_208 = dVar2 * local_b8.x[2][3] + dVar6 * local_b8.x[0][3] + dVar3 * local_b8.x[1][3] +
                local_b8.x[3][3];
    uStack_200 = 0;
    local_198.z = local_1f8 -
                  (local_138.x[2][2] * dVar2 + local_138.x[0][2] * dVar6 + local_138.x[1][2] * dVar3
                  + local_138.x[3][2]) / dVar13;
    auVar9._0_8_ = dVar2 * local_138.x[2][0] + dVar6 * local_138.x[0][0] + dVar3 * local_138.x[1][0]
                   + local_138.x[3][0];
    auVar9._8_8_ = dVar2 * local_138.x[2][1] + dVar6 * local_138.x[0][1] + dVar3 * local_138.x[1][1]
                   + local_138.x[3][1];
    auVar10 = divpd(auVar9,auVar12);
    local_198.x = local_1d8 - auVar10._0_8_;
    local_198.y = dStack_1d0 - auVar10._8_8_;
    dVar6 = local_198.z * local_198.z + local_198.x * local_198.x + local_198.y * local_198.y;
    if (4.450147717014403e-308 <= dVar6) {
      dVar6 = SQRT(dVar6);
    }
    else {
      dVar6 = Imath_2_5::Vec3<double>::lengthTiny(&local_198);
    }
    if (1e-08 <= dVar6) {
      __assert_fail("(b - b1).length() < eps",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testProcrustes.cpp"
                    ,0x53,"void testTranslationRotationMatrix(const Imath_2_5::M44d &) [T = double]"
                   );
    }
    auVar7._8_8_ = local_208;
    auVar7._0_8_ = local_208;
    auVar4._8_8_ = dStack_1e0;
    auVar4._0_8_ = local_1e8;
    auVar10 = divpd(auVar4,auVar7);
    local_198.x = local_1d8 - auVar10._0_8_;
    local_198.y = dStack_1d0 - auVar10._8_8_;
    local_198.z = local_1f8 - dVar14 / local_208;
    dVar6 = local_198.z * local_198.z + local_198.x * local_198.x + local_198.y * local_198.y;
    if (4.450147717014403e-308 <= dVar6) {
      dVar6 = SQRT(dVar6);
    }
    else {
      dVar6 = Imath_2_5::Vec3<double>::lengthTiny(&local_198);
    }
    if (1e-08 <= dVar6) break;
    lVar5 = lVar5 + 0x18;
    if (lVar5 == 0xb8) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  OK\n",5);
      operator_delete(weights,0x38);
      if (local_248.
          super__Vector_base<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_>.
          _M_impl.super__Vector_impl_data._M_start != (Vec3<double> *)0x0) {
        operator_delete(local_248.
                        super__Vector_base<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_248.
                              super__Vector_base<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_248.
                              super__Vector_base<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_228.
          super__Vector_base<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_>.
          _M_impl.super__Vector_impl_data._M_start != (Vec3<double> *)0x0) {
        operator_delete(local_228.
                        super__Vector_base<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_228.
                              super__Vector_base<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_228.
                              super__Vector_base<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      return;
    }
  }
  __assert_fail("(b - b2).length() < eps",
                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testProcrustes.cpp"
                ,0x54,"void testTranslationRotationMatrix(const Imath_2_5::M44d &) [T = double]");
}

Assistant:

void
testTranslationRotationMatrix (const IMATH_INTERNAL_NAMESPACE::M44d& mat)
{
    std::cout << "Testing known translate/rotate matrix:\n " << mat;
    typedef IMATH_INTERNAL_NAMESPACE::Vec3<T> Vec;

    static IMATH_INTERNAL_NAMESPACE::Rand48 rand (2047);

    size_t numPoints = 7;
    std::vector<Vec> from;  from.reserve (numPoints);
    std::vector<Vec> to;    to.reserve (numPoints);
    for (size_t i = 0; i < numPoints; ++i)
    {
        IMATH_INTERNAL_NAMESPACE::V3d a (rand.nextf(), rand.nextf(), rand.nextf());
        IMATH_INTERNAL_NAMESPACE::V3d b = a * mat;

        from.push_back (Vec(a));
        to.push_back (Vec(b));
    }

    std::vector<T> weights (numPoints, T(1));
    const IMATH_INTERNAL_NAMESPACE::M44d m1 = procrustesRotationAndTranslation (&from[0], &to[0], &weights[0], numPoints);
    const IMATH_INTERNAL_NAMESPACE::M44d m2 = procrustesRotationAndTranslation (&from[0], &to[0], numPoints);

    const T eps = sizeof(T) == 8 ? 1e-8 : 1e-4;
    for (size_t i = 0; i < numPoints; ++i)
    {
        const IMATH_INTERNAL_NAMESPACE::V3d a = from[i];
        const IMATH_INTERNAL_NAMESPACE::V3d b = to[i];
        const IMATH_INTERNAL_NAMESPACE::V3d b1 = a * m1;
        const IMATH_INTERNAL_NAMESPACE::V3d b2 = a * m2;

        assert ((b - b1).length() < eps);
        assert ((b - b2).length() < eps);
    }
    std::cout << "  OK\n";
}